

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall QSequentialAnimationGroupPrivate::restart(QSequentialAnimationGroupPrivate *this)

{
  parameter_type pVar1;
  parameter_type pVar2;
  qsizetype qVar3;
  long in_RDI;
  undefined7 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  QSequentialAnimationGroupPrivate *in_stack_00000008;
  int index;
  int in_stack_0000001c;
  long lVar4;
  undefined1 intermediate;
  
  lVar4 = in_RDI;
  pVar1 = ::QObjectCompatProperty::operator_cast_to_Direction
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                      *)0x689f1f);
  intermediate = (undefined1)((ulong)lVar4 >> 0x38);
  if (pVar1 == Forward) {
    *(undefined4 *)(in_RDI + 0xe0) = 0;
    if (*(int *)(in_RDI + 0xc0) == 0) {
      activateCurrentAnimation
                ((QSequentialAnimationGroupPrivate *)CONCAT17(unaff_retaddr_00,unaff_retaddr),
                 (bool)intermediate);
    }
    else {
      setCurrentAnimation(in_stack_00000008,in_stack_0000001c,(bool)unaff_retaddr_00);
    }
  }
  else {
    pVar2 = QObjectBindableProperty::operator_cast_to_int
                      ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                        *)0x689f67);
    *(parameter_type *)(in_RDI + 0xe0) = pVar2 + -1;
    qVar3 = QList<QAbstractAnimation_*>::size((QList<QAbstractAnimation_*> *)(in_RDI + 0xa0));
    if (*(int *)(in_RDI + 0xc0) == (int)qVar3 + -1) {
      activateCurrentAnimation
                ((QSequentialAnimationGroupPrivate *)CONCAT17(unaff_retaddr_00,unaff_retaddr),
                 (bool)intermediate);
    }
    else {
      setCurrentAnimation(in_stack_00000008,in_stack_0000001c,(bool)unaff_retaddr_00);
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::restart()
{
    // restarting the group by making the first/last animation the current one
    if (direction == QAbstractAnimation::Forward) {
        lastLoop = 0;
        if (currentAnimationIndex == 0)
            activateCurrentAnimation();
        else
            setCurrentAnimation(0);
    } else { // direction == QAbstractAnimation::Backward
        lastLoop = loopCount - 1;
        int index = animations.size() - 1;
        if (currentAnimationIndex == index)
            activateCurrentAnimation();
        else
            setCurrentAnimation(index);
    }
}